

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::permissions(path *p,perms prms,perm_options opts)

{
  bool bVar1;
  undefined8 uVar2;
  path *in_stack_00000020;
  string *in_stack_00000028;
  filesystem_error *in_stack_00000030;
  error_code in_stack_00000038;
  error_code ec;
  int in_stack_000001dc;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  error_code *in_stack_ffffffffffffffc0;
  perm_options in_stack_ffffffffffffffcc;
  perms in_stack_ffffffffffffffce;
  path *in_stack_ffffffffffffffd0;
  error_code local_20 [2];
  
  std::error_code::error_code
            ((error_code *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  permissions(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc,
              in_stack_ffffffffffffffc0);
  bVar1 = std::error_code::operator_cast_to_bool(local_20);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x90);
  std::error_code::value(local_20);
  detail::systemErrorText<int>(in_stack_000001dc);
  filesystem_error::filesystem_error
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000038);
  __cxa_throw(uVar2,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void permissions(const path& p, perms prms, perm_options opts)
{
    std::error_code ec;
    permissions(p, prms, opts, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
}